

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxerManager.cpp
# Opt level: O2

void __thiscall
MuxerManager::checkTrackList(MuxerManager *this,vector<StreamInfo,_std::allocator<StreamInfo>_> *ci)

{
  string *__lhs;
  pointer pSVar1;
  byte bVar2;
  bool bVar3;
  __type _Var4;
  ostream *poVar5;
  undefined4 *puVar6;
  byte bVar7;
  char *pcVar8;
  bool bVar9;
  StreamInfo *si;
  pointer pSVar10;
  uint *local_1c8;
  undefined8 local_1c0;
  uint local_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  ostringstream ss;
  
  if (this->m_demuxMode != false) {
    return;
  }
  pSVar1 = (ci->super__Vector_base<StreamInfo,_std::allocator<StreamInfo>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  bVar3 = false;
  bVar7 = 0;
  bVar2 = 0;
  bVar9 = false;
  for (pSVar10 = (ci->super__Vector_base<StreamInfo,_std::allocator<StreamInfo>_>)._M_impl.
                 super__Vector_impl_data._M_start; pSVar10 != pSVar1; pSVar10 = pSVar10 + 1) {
    __lhs = &pSVar10->m_codec;
    _Var4 = std::operator==(__lhs,&::h264CodecInfo.programName);
    if (_Var4) {
      bVar9 = true;
    }
    else {
      _Var4 = std::operator==(__lhs,&::h264DepCodecInfo.programName);
      if (_Var4) {
        bVar2 = 1;
      }
      else {
        _Var4 = std::operator==(__lhs,&::aacCodecInfo.programName);
        if (_Var4) {
          bVar3 = true;
        }
        else {
          _Var4 = std::operator==(__lhs,&::mlpCodecInfo.programName);
          bVar7 = bVar7 | _Var4;
        }
      }
    }
  }
  if (this->m_bluRayMode != false) {
    pcVar8 = 
    "Warning! MLP codec is not standard for BD disks, the disk will not play in a Blu-ray player.";
    if (bVar3) {
      pcVar8 = 
      "Warning! AAC codec is not standard for BD disks, the disk will not play in a Blu-ray player."
      ;
    }
    if (bVar7 == 0 && !bVar3) {
      if ((V3_flags & 0x44U) != 4) goto LAB_001c9a91;
      pcVar8 = 
      "Warning! Dolby Vision Double Layer Single Tracks are not standard for BD disks, the disk will not play in a Blu-ray player."
      ;
    }
    poVar5 = std::operator<<((ostream *)&std::cerr,pcVar8);
    std::endl<char,std::char_traits<char>>(poVar5);
    sLastMsg = true;
  }
LAB_001c9a91:
  if (bVar9 || (bool)(~bVar2 & 1)) {
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
  std::operator<<((ostream *)&ss,
                  "Fatal error: MVC depended view track can\'t be muxed without AVC base view track"
                 );
  puVar6 = (undefined4 *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  *puVar6 = 0x1f8;
  *(undefined4 **)(puVar6 + 2) = puVar6 + 6;
  if (local_1c8 == &local_1b8) {
    puVar6[6] = local_1b8;
    puVar6[7] = uStack_1b4;
    puVar6[8] = uStack_1b0;
    puVar6[9] = uStack_1ac;
  }
  else {
    *(uint **)(puVar6 + 2) = local_1c8;
    *(ulong *)(puVar6 + 6) = CONCAT44(uStack_1b4,local_1b8);
  }
  *(undefined8 *)(puVar6 + 4) = local_1c0;
  local_1b8 = local_1b8 & 0xffffff00;
  __cxa_throw(puVar6,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
}

Assistant:

void MuxerManager::checkTrackList(const vector<StreamInfo>& ci) const
{
    if (m_demuxMode)
        return;

    bool avcFound = false;
    bool mvcFound = false;
    bool aacFound = false;
    bool mlpFound = false;

    for (const StreamInfo& si : ci)
    {
        if (si.m_codec == h264CodecInfo.programName)
            avcFound = true;
        else if (si.m_codec == h264DepCodecInfo.programName)
            mvcFound = true;
        else if (si.m_codec == aacCodecInfo.programName)
            aacFound = true;
        else if (si.m_codec == mlpCodecInfo.programName)
            mlpFound = true;
    }

    if (m_bluRayMode)
    {
        if (aacFound)
            LTRACE(LT_ERROR, 2,
                   "Warning! AAC codec is not standard for BD disks, the disk will not play in a Blu-ray player.");
        else if (m_bluRayMode && mlpFound)
            LTRACE(LT_ERROR, 2,
                   "Warning! MLP codec is not standard for BD disks, the disk will not play in a Blu-ray player.");
        else if (m_bluRayMode && (V3_flags & DV) && !(V3_flags & BL_TRACK))
            LTRACE(LT_ERROR, 2,
                   "Warning! Dolby Vision Double Layer Single Tracks are not standard for BD disks, the disk will "
                   "not play in a Blu-ray player.");
    }
    if (!avcFound && mvcFound)
        THROW(ERR_INVALID_STREAMS_SELECTED,
              "Fatal error: MVC depended view track can't be muxed without AVC base view track")
}